

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O1

token_value * __thiscall cs::compiler_type::new_value(compiler_type *this,var *val)

{
  proxy *ppVar1;
  token_value *ptVar2;
  var *size;
  any local_18;
  
  size = val;
  add_constant(this,val);
  ptVar2 = (token_value *)token_base::operator_new((token_base *)0x18,(size_t)size);
  ppVar1 = val->mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  (ptVar2->super_token_base).line_num = 1;
  (ptVar2->super_token_base)._vptr_token_base = (_func_int **)&PTR__token_value_00336468;
  (ptVar2->mVal).mDat = ppVar1;
  local_18.mDat = (proxy *)0x0;
  cs_impl::any::recycle(&local_18);
  return ptVar2;
}

Assistant:

token_value *new_value(const var &val)
		{
			add_constant(val);
			return new token_value(val);
		}